

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_scriptedmarine.cpp
# Opt level: O3

int AF_A_M_FirePlasma(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  PClassActor *type;
  AActor *self;
  char *__assertion;
  AActor *pAVar6;
  bool bVar7;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005c572e;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005c571e;
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_005c55dc;
    pPVar5 = (self->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (self->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar7 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar7) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar7 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar7) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005c572e;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_005c571e;
LAB_005c55dc:
    self = (AActor *)0x0;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005c571e:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005c572e;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar5 = (PClass *)puVar2[1];
          if (pPVar5 == (PClass *)0x0) {
            pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2);
            puVar2[1] = pPVar5;
          }
          bVar7 = pPVar5 != (PClass *)0x0;
          if (pPVar5 != pPVar3 && bVar7) {
            do {
              pPVar5 = pPVar5->ParentClass;
              bVar7 = pPVar5 != (PClass *)0x0;
              if (pPVar5 == pPVar3) break;
            } while (pPVar5 != (PClass *)0x0);
          }
          if (!bVar7) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005c572e;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005c571e;
    }
    if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005c572e:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                    ,0x22f,"int AF_A_M_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  pAVar6 = (self->target).field_0.p;
  if (pAVar6 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  A_FaceTarget(self);
  pAVar6 = (self->target).field_0.p;
  if (pAVar6 != (AActor *)0x0) {
    if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005c56d7;
    (self->target).field_0.p = (AActor *)0x0;
  }
  pAVar6 = (AActor *)0x0;
LAB_005c56d7:
  type = PClass::FindActor("PlasmaBall");
  P_SpawnMissile(self,pAVar6,type,(AActor *)0x0);
  self->special1 = level.maptime + 0x14;
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_M_FirePlasma)
{
	PARAM_ACTION_PROLOGUE;

	if (self->target == NULL)
		return 0;

	A_FaceTarget (self);
	P_SpawnMissile (self, self->target, PClass::FindActor("PlasmaBall"));
	self->special1 = level.maptime + 20;
	return 0;
}